

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O1

void png_do_check_palette_indexes(png_structrp png_ptr,png_row_infop row_info)

{
  byte bVar1;
  byte *pbVar2;
  png_size_t pVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  bVar1 = row_info->bit_depth;
  if (((int)(uint)png_ptr->num_palette < 1 << (bVar1 & 0x1f) && png_ptr->num_palette != 0) &&
     (bVar1 - 1 < 8)) {
    uVar6 = -((uint)row_info->pixel_depth * row_info->width) & 7;
    pbVar2 = png_ptr->row_buf;
    pVar3 = row_info->rowbytes;
    pbVar9 = pbVar2 + pVar3;
    switch((uint)bVar1) {
    case 1:
      if (0 < (long)pVar3) {
        do {
          if (*pbVar9 >> (sbyte)uVar6 != 0) {
            png_ptr->num_palette_max = 1;
          }
          pbVar9 = pbVar9 + -1;
          uVar6 = 0;
        } while (pbVar2 < pbVar9);
      }
      break;
    case 2:
      if (0 < (long)pVar3) {
        uVar5 = png_ptr->num_palette_max;
        do {
          bVar1 = *pbVar9 >> (sbyte)uVar6;
          uVar10 = bVar1 & 3;
          uVar6 = uVar10;
          if ((int)uVar10 <= (int)uVar5) {
            uVar6 = uVar5;
          }
          uVar12 = bVar1 >> 2 & 3;
          uVar13 = uVar12;
          if (uVar12 <= uVar6) {
            uVar13 = uVar6;
          }
          uVar7 = bVar1 >> 4 & 3;
          uVar8 = uVar7;
          if (uVar7 <= uVar13) {
            uVar8 = uVar13;
          }
          uVar11 = (uint)(bVar1 >> 6);
          uVar14 = uVar11;
          if (uVar11 <= uVar8) {
            uVar14 = uVar8;
          }
          if (((((int)uVar5 < (int)uVar10) || (uVar6 < uVar12)) || (uVar13 < uVar7)) ||
             (uVar8 < uVar11)) {
            png_ptr->num_palette_max = uVar14;
          }
          pbVar9 = pbVar9 + -1;
          uVar6 = 0;
          uVar5 = uVar14;
        } while (pbVar2 < pbVar9);
      }
      break;
    case 4:
      if (0 < (long)pVar3) {
        uVar5 = png_ptr->num_palette_max;
        do {
          bVar1 = *pbVar9 >> (sbyte)uVar6;
          uVar6 = bVar1 & 0xf;
          bVar4 = (int)uVar5 < (int)uVar6;
          if ((int)uVar6 <= (int)uVar5) {
            uVar6 = uVar5;
          }
          uVar10 = (uint)(bVar1 >> 4);
          uVar5 = uVar10;
          if (uVar10 <= uVar6) {
            uVar5 = uVar6;
          }
          if (bVar4 || uVar6 < uVar10) {
            png_ptr->num_palette_max = uVar5;
          }
          pbVar9 = pbVar9 + -1;
          uVar6 = 0;
        } while (pbVar2 < pbVar9);
      }
      break;
    case 8:
      if (0 < (long)pVar3) {
        uVar6 = png_ptr->num_palette_max;
        do {
          if ((int)uVar6 < (int)(uint)*pbVar9) {
            uVar6 = (uint)*pbVar9;
            png_ptr->num_palette_max = uVar6;
          }
          pbVar9 = pbVar9 + -1;
        } while (pbVar2 < pbVar9);
      }
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_check_palette_indexes(png_structrp png_ptr, png_row_infop row_info)
{
   if (png_ptr->num_palette < (1 << row_info->bit_depth) &&
      png_ptr->num_palette > 0) /* num_palette can be 0 in MNG files */
   {
      /* Calculations moved outside switch in an attempt to stop different
       * compiler warnings.  'padding' is in *bits* within the last byte, it is
       * an 'int' because pixel_depth becomes an 'int' in the expression below,
       * and this calculation is used because it avoids warnings that other
       * forms produced on either GCC or MSVC.
       */
      int padding = PNG_PADBITS(row_info->pixel_depth, row_info->width);
      png_bytep rp = png_ptr->row_buf + row_info->rowbytes;

      switch (row_info->bit_depth)
      {
         case 1:
         {
            /* in this case, all bytes must be 0 so we don't need
             * to unpack the pixels except for the rightmost one.
             */
            for (; rp > png_ptr->row_buf; rp--)
            {
              if ((*rp >> padding) != 0)
                 png_ptr->num_palette_max = 1;
              padding = 0;
            }

            break;
         }

         case 2:
         {
            for (; rp > png_ptr->row_buf; rp--)
            {
              int i = ((*rp >> padding) & 0x03);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              i = (((*rp >> padding) >> 2) & 0x03);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              i = (((*rp >> padding) >> 4) & 0x03);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              i = (((*rp >> padding) >> 6) & 0x03);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              padding = 0;
            }

            break;
         }

         case 4:
         {
            for (; rp > png_ptr->row_buf; rp--)
            {
              int i = ((*rp >> padding) & 0x0f);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              i = (((*rp >> padding) >> 4) & 0x0f);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              padding = 0;
            }

            break;
         }

         case 8:
         {
            for (; rp > png_ptr->row_buf; rp--)
            {
               if (*rp > png_ptr->num_palette_max)
                  png_ptr->num_palette_max = (int) *rp;
            }

            break;
         }

         default:
            break;
      }
   }
}